

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBABecLap_F.cpp
# Opt level: O1

void __thiscall
amrex::MLEBABecLap::Fapply(MLEBABecLap *this,int amrlev,int mglev,MultiFab *out,MultiFab *in)

{
  long *plVar1;
  double dVar2;
  double dVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  int iVar7;
  Location LVar8;
  Location LVar9;
  int iVar10;
  int iVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  uint ncomp;
  FabType FVar22;
  uint uVar23;
  int iVar24;
  uint uVar25;
  long lVar26;
  FabArray<amrex::EBCellFlagFab> *pFVar27;
  int *piVar28;
  ulong uVar29;
  int iVar30;
  long lVar31;
  int iVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  void *__s;
  long lVar41;
  long lVar42;
  long lVar43;
  bool bVar44;
  bool bVar45;
  Box tbx;
  MFIter mfi;
  MFItInfo mfi_info;
  long local_de8;
  int local_dd0;
  int local_dcc;
  int local_dc8;
  int iStack_dc4;
  ulong local_db8;
  Box local_da4;
  double local_d88;
  undefined8 uStack_d80;
  double local_d70;
  ulong local_d68;
  ulong local_d60;
  long local_d58;
  ulong local_d50;
  long local_d48;
  ulong local_d40;
  long local_d38;
  int local_d2c;
  int local_d28;
  int local_d24;
  int local_d20;
  int local_d1c;
  int local_d18;
  int local_d14;
  int local_d10;
  int local_d0c;
  undefined8 local_d08;
  long lStack_d00;
  long local_cf0;
  long local_ce8;
  undefined8 *local_ce0;
  undefined8 *local_cd8;
  undefined8 *local_cd0;
  undefined8 *local_cc8;
  long *local_cc0;
  long *local_cb8;
  long *local_cb0;
  long *local_ca8;
  long *local_ca0;
  MultiCutFab *local_c98;
  MultiCutFab *local_c90;
  MultiCutFab *local_c88;
  FabArray<amrex::FArrayBox> *local_c80;
  _Head_base<0UL,_amrex::MultiFab_*,_false> local_c78;
  Real local_c70;
  FabArray<amrex::FArrayBox> *local_c68;
  ulong local_c60;
  ulong local_c58;
  long local_c50;
  long local_c48;
  long local_c40;
  Array4<double> local_c38;
  MultiCutFab *local_bf8;
  MultiCutFab *pMStack_bf0;
  MultiCutFab *local_be8;
  MultiCutFab *local_bd8;
  MultiCutFab *pMStack_bd0;
  MultiCutFab *local_bc8;
  long local_bc0;
  FabArray<amrex::IArrayBox> *local_bb8;
  FabArray<amrex::FArrayBox> *local_bb0;
  FabArray<amrex::FArrayBox> *local_ba8;
  FabArray<amrex::FArrayBox> *local_ba0;
  FabArray<amrex::EBCellFlagFab> *local_b98;
  FabArray<amrex::FArrayBox> *local_b90;
  FabArray<amrex::FArrayBox> *local_b88;
  ulong local_b80;
  double *local_b78;
  long local_b70;
  long local_b68;
  long local_b60;
  long local_b58;
  ulong local_b50;
  long local_b48;
  ulong local_b40;
  long local_b38;
  long local_b30;
  Array4<const_double> local_b28;
  Array4<const_double> local_ae8;
  Array4<const_double> local_aa8;
  Array4<const_double> local_a68;
  Array4<const_double> local_a28;
  undefined1 local_9e8 [32];
  double *local_9c8;
  int local_9c0;
  int local_9bc;
  int iStack_9b8;
  int iStack_9b4;
  int iStack_9b0;
  undefined1 local_9a8 [32];
  double *local_988;
  int local_980;
  int local_97c;
  int iStack_978;
  int iStack_974;
  int iStack_970;
  Box local_968;
  undefined1 local_948 [16];
  undefined1 local_938 [16];
  undefined8 local_928;
  undefined8 uStack_920;
  double *local_918;
  ulong uStack_910;
  double *local_908;
  ulong uStack_900;
  undefined1 local_8f8 [40];
  int iStack_8d0;
  int iStack_8cc;
  int iStack_8c8;
  undefined8 uStack_8c4;
  undefined1 local_8b8 [40];
  int iStack_890;
  int iStack_88c;
  int iStack_888;
  undefined8 uStack_884;
  undefined1 local_878 [40];
  int iStack_850;
  int iStack_84c;
  int iStack_848;
  undefined8 uStack_844;
  Array4<const_double> local_838;
  Array4<const_double> local_7f8;
  Array4<const_double> local_7b8;
  Array4<const_double> local_778;
  Array4<const_double> local_738;
  Array4<const_double> local_6f8;
  Array4<const_amrex::EBCellFlag> local_6b8;
  int local_678;
  int iStack_674;
  int iStack_670;
  int iStack_66c;
  undefined1 local_668 [16];
  undefined1 local_658 [16];
  undefined1 local_648 [16];
  MFIter local_630;
  Array4<const_double> local_5d0;
  Array4<const_int> local_590;
  MFItInfo local_54c;
  undefined1 local_538 [865];
  bool local_1d7;
  bool local_1d6;
  undefined1 uStack_1d5;
  int local_1d4;
  int iStack_1d0;
  int iStack_1cc;
  int iStack_1c8;
  undefined4 uStack_1c4;
  double *local_1c0;
  Long LStack_1b8;
  Long local_1b0;
  int iStack_1a8;
  int iStack_1a4;
  int iStack_1a0;
  int iStack_19c;
  int iStack_198;
  int iStack_190;
  int iStack_18c;
  int iStack_188;
  undefined4 uStack_184;
  double *local_180;
  Long LStack_178;
  double *local_170;
  int iStack_168;
  int iStack_164;
  int iStack_160;
  int iStack_15c;
  int iStack_158;
  bool bStack_150;
  bool bStack_14f;
  undefined2 uStack_14e;
  int iStack_14c;
  int iStack_148;
  undefined4 uStack_144;
  undefined8 local_140;
  double *local_138;
  ulong uStack_130;
  double *local_128;
  int iStack_120;
  int iStack_11c;
  int iStack_118;
  int iStack_114;
  int iStack_110;
  int iStack_108;
  int iStack_104;
  int iStack_100;
  undefined4 uStack_fc;
  double *local_f8;
  Long LStack_f0;
  double *local_e8;
  int iStack_e0;
  int iStack_dc;
  int iStack_d8;
  int iStack_d4;
  int iStack_d0;
  int iStack_c8;
  int iStack_c4;
  int iStack_c0;
  undefined4 uStack_bc;
  double *local_b8;
  Long LStack_b0;
  double *local_a8;
  int iStack_a0;
  int iStack_9c;
  int iStack_98;
  int iStack_94;
  int iStack_90;
  int iStack_88;
  int iStack_84;
  int iStack_80;
  undefined4 uStack_7c;
  double *local_78;
  ulong uStack_70;
  double *local_68;
  int iStack_60;
  int iStack_5c;
  int iStack_58;
  int iStack_54;
  int iStack_50;
  int local_4c;
  int iStack_48;
  int iStack_44;
  int iStack_40;
  
  local_cf0 = (long)amrlev;
  local_ce8 = (long)mglev;
  local_b90 = (FabArray<amrex::FArrayBox> *)
              (*(long *)&(this->m_a_coeffs).
                         super_vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[local_cf0].
                         super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                         super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> +
              local_ce8 * 0x180);
  lVar39 = *(long *)&(this->m_b_coeffs).
                     super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[local_cf0].
                     super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                     .
                     super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
  ;
  local_bb8 = (FabArray<amrex::IArrayBox> *)
              (local_ce8 * 0x180 +
              *(long *)&(this->m_cc_mask).
                        super_vector<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>,_std::allocator<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>_>_>
                        .
                        super__Vector_base<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>,_std::allocator<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[local_cf0].
                        super_vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>.
                        super__Vector_base<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>);
  lVar26 = *(long *)&(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_geom.
                     super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[local_cf0].
                     super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                     super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
  lVar42 = local_ce8 * 200;
  dVar2 = *(double *)(lVar26 + 0x38 + lVar42);
  local_d88 = *(double *)(lVar26 + 0x40 + lVar42);
  uStack_d80 = 0;
  dVar3 = *(double *)(lVar26 + 0x48 + lVar42);
  lVar26 = *(long *)(*(long *)&(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_factory
                               .
                               super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                               .
                               super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[local_cf0].
                               super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                               .
                               super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                    + local_ce8 * 8);
  local_d24 = mglev;
  local_c68 = &out->super_FabArray<amrex::FArrayBox>;
  local_b88 = &in->super_FabArray<amrex::FArrayBox>;
  if (lVar26 == 0) {
    lVar26 = 0;
  }
  else {
    lVar26 = __dynamic_cast(lVar26,&FabFactory<amrex::FArrayBox>::typeinfo,
                            &EBFArrayBoxFactory::typeinfo,0);
  }
  if (lVar26 == 0) {
    pFVar27 = (FabArray<amrex::EBCellFlagFab> *)0x0;
    local_c80 = (FabArray<amrex::FArrayBox> *)0x0;
    local_bd8 = (MultiCutFab *)0x0;
    pMStack_bd0 = (MultiCutFab *)0x0;
    local_bc8 = (MultiCutFab *)0x0;
    local_bf8 = (MultiCutFab *)0x0;
    pMStack_bf0 = (MultiCutFab *)0x0;
    local_be8 = (MultiCutFab *)0x0;
    local_c88 = (MultiCutFab *)0x0;
    local_c90 = (MultiCutFab *)0x0;
    local_c98 = (MultiCutFab *)0x0;
  }
  else {
    pFVar27 = EBDataCollection::getMultiEBCellFlagFab(*(EBDataCollection **)(lVar26 + 0xd8));
    local_c80 = &EBDataCollection::getVolFrac(*(EBDataCollection **)(lVar26 + 0xd8))->
                 super_FabArray<amrex::FArrayBox>;
    EBDataCollection::getAreaFrac(*(EBDataCollection **)(lVar26 + 0xd8));
    EBDataCollection::getFaceCent(*(EBDataCollection **)(lVar26 + 0xd8));
    local_c88 = EBDataCollection::getBndryArea(*(EBDataCollection **)(lVar26 + 0xd8));
    local_c90 = EBDataCollection::getBndryCent(*(EBDataCollection **)(lVar26 + 0xd8));
    local_c98 = EBDataCollection::getCentroid(*(EBDataCollection **)(lVar26 + 0xd8));
  }
  local_c78._M_head_impl =
       *(MultiFab **)
        &(((this->m_eb_phi).
           super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
           .
           super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
  iVar7 = this->m_is_eb_inhomog;
  ncomp = (*(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp._vptr_MLLinOp[5])(this);
  local_918 = (double *)0x0;
  uStack_910 = 0;
  local_908 = (double *)0x0;
  uStack_900 = 0;
  local_928 = 0;
  uStack_920._0_4_ = 0;
  uStack_920._4_4_ = 0;
  local_c70 = this->m_a_scalar;
  local_d70 = this->m_b_scalar;
  local_bc0 = local_cf0 * 3;
  lVar26 = *(long *)&(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_geom.
                     super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[local_cf0].
                     super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                     super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
  local_d28 = *(int *)(lVar26 + 0xac + lVar42);
  plVar1 = (long *)(lVar26 + 0xb0 + lVar42);
  local_d08 = *plVar1;
  lStack_d00 = plVar1[1];
  local_d2c = *(int *)(lVar26 + 0xc0 + lVar42);
  uVar4 = *(undefined1 *)(lVar26 + 0x51 + lVar42);
  uVar5 = *(undefined1 *)(lVar26 + 0x52 + lVar42);
  uVar6 = *(undefined1 *)(lVar26 + 0x53 + lVar42);
  local_54c.dynamic = true;
  local_54c.device_sync = true;
  local_54c.num_streams = Gpu::Device::max_gpu_streams;
  local_54c.do_tiling = true;
  local_54c.tilesize.vect[2] = DAT_00753ec0;
  local_54c.tilesize.vect[0] = (int)FabArrayBase::mfiter_tile_size;
  local_54c.tilesize.vect[1] = FabArrayBase::mfiter_tile_size._4_4_;
  MFIter::MFIter(&local_630,&local_c68->super_FabArrayBase,&local_54c);
  if (local_630.currentIndex < local_630.endIndex) {
    lVar26 = local_ce8 * 0x480;
    local_ba0 = (FabArray<amrex::FArrayBox> *)(lVar39 + lVar26);
    local_ba8 = (FabArray<amrex::FArrayBox> *)(lVar39 + lVar26 + 0x180);
    local_bb0 = (FabArray<amrex::FArrayBox> *)(lVar26 + lVar39 + 0x300);
    bVar44 = local_c78._M_head_impl != (MultiFab *)0x0;
    local_658._8_4_ = 0;
    local_658._0_8_ = -dVar2 * local_d70 * dVar2;
    local_658._12_4_ = 0x80000000;
    uVar23 = (uint)((ulong)uStack_d80 >> 0x20);
    local_668._8_4_ = (int)uStack_d80;
    local_668._0_8_ = -local_d88 * local_d70 * local_d88;
    local_668._12_4_ = uVar23 ^ 0x80000000;
    local_648._8_4_ = 0;
    local_648._0_8_ = -dVar3 * local_d70 * dVar3;
    local_648._12_4_ = 0x80000000;
    local_938._8_8_ = 0;
    local_938._0_8_ = dVar2 * local_d70 * dVar2;
    local_948._8_4_ = (int)uStack_d80;
    local_948._0_8_ = local_d88 * local_d70 * local_d88;
    local_948._12_4_ = uVar23;
    local_d70 = local_d70 * dVar3 * dVar3;
    local_ca0 = (long *)(local_538 + 0x88);
    local_ca8 = (long *)(local_538 + 200);
    local_cb0 = (long *)(local_538 + 0x110);
    local_cb8 = (long *)(local_538 + 0x158);
    local_cc0 = (long *)(local_538 + 0x1a0);
    local_cc8 = (undefined8 *)(local_538 + 0x1e0);
    local_678 = (int)lStack_d00;
    iStack_674 = (int)local_d08;
    iStack_670 = local_d08._4_4_;
    iStack_66c = local_d08._4_4_;
    local_cd0 = (undefined8 *)(local_538 + 0x220);
    local_cd8 = (undefined8 *)(local_538 + 0x260);
    local_ce0 = (undefined8 *)(local_538 + 0x2a0);
    local_c58 = (ulong)ncomp;
    local_b98 = pFVar27;
    do {
      pFVar27 = local_b98;
      MFIter::tilebox(&local_da4,&local_630);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_a68,local_b88,&local_630);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_c38,local_c68,&local_630);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_a28,local_b90,&local_630);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_aa8,local_ba0,&local_630);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_ae8,local_ba8,&local_630);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_b28,local_bb0,&local_630);
      FVar22 = regular;
      if (pFVar27 != (FabArray<amrex::EBCellFlagFab> *)0x0) {
        piVar28 = &local_630.currentIndex;
        if (local_630.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar28 = ((local_630.local_index_map)->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start + local_630.currentIndex;
        }
        FVar22 = EBCellFlagFab::getType
                           ((pFVar27->m_fabs_v).
                            super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[*piVar28],&local_da4);
      }
      iVar11 = local_da4.bigend.vect[2];
      iVar10 = local_da4.bigend.vect[0];
      iVar24 = local_da4.smallend.vect[0];
      if (FVar22 == regular) {
        if (0 < (int)ncomp) {
          local_c60 = (ulong)(uint)local_da4.smallend.vect[2];
          local_b80 = (ulong)(uint)local_da4.bigend.vect[1];
          local_d58 = (long)local_da4.smallend.vect[1];
          local_b48 = (long)local_da4.smallend.vect[0];
          local_d10 = local_da4.bigend.vect[1] + 1;
          local_c40 = local_b48 * 8;
          local_d1c = local_da4.smallend.vect[2] + 1;
          local_c48 = local_d58 + 1;
          local_d20 = local_da4.smallend.vect[2] - 1;
          local_d14 = local_da4.smallend.vect[1] + -1;
          local_d18 = local_da4.smallend.vect[0] + -1;
          local_d0c = local_da4.bigend.vect[0];
          uVar23 = (local_da4.bigend.vect[0] - local_da4.smallend.vect[0]) + 1;
          local_b50 = (ulong)uVar23;
          local_c50 = 0;
          local_d60 = 0;
          do {
            local_dd0 = local_d1c;
            local_dcc = local_d20;
            uVar29 = local_c60;
            if (local_da4.smallend.vect[2] <= local_da4.bigend.vect[2]) {
              do {
                local_d50 = uVar29;
                if (local_da4.smallend.vect[1] <= local_da4.bigend.vect[1]) {
                  lVar34 = (long)(int)local_d50;
                  local_d40 = local_c38.jstride * 8;
                  lVar31 = (long)local_c38.p +
                           local_c38.nstride * local_c50 +
                           (local_d58 - local_c38.begin.y) * local_d40 +
                           (lVar34 - local_c38.begin.z) * local_c38.kstride * 8 +
                           (long)local_c38.begin.x * -8 + local_c40;
                  local_d38 = local_a28.jstride * 8;
                  lVar43 = (long)local_a28.p +
                           (local_d58 - local_a28.begin.y) * local_d38 +
                           (lVar34 - local_a28.begin.z) * local_a28.kstride * 8 +
                           (long)local_a28.begin.x * -8 + local_c40;
                  local_d68 = local_b28.jstride * 8;
                  lVar39 = (local_d58 - local_b28.begin.y) * local_d68;
                  lVar36 = (long)local_b28.p +
                           (lVar34 - local_b28.begin.z) * local_b28.kstride * 8 + lVar39 +
                           local_b28.nstride * local_c50 + (long)local_b28.begin.x * -8 + local_c40;
                  local_d08 = (long)local_b28.p +
                              ((long)local_dd0 - (long)local_b28.begin.z) * local_b28.kstride * 8 +
                              lVar39 + local_b28.nstride * local_c50 + (long)local_b28.begin.x * -8
                              + local_c40;
                  local_b30 = local_ae8.jstride * 8;
                  lVar39 = (lVar34 - local_ae8.begin.z) * local_ae8.kstride;
                  lVar42 = (long)local_ae8.p +
                           (local_c48 - local_ae8.begin.y) * local_b30 + lVar39 * 8 +
                           local_ae8.nstride * local_c50 + (long)local_ae8.begin.x * -8 + local_c40;
                  lVar33 = (long)local_ae8.p +
                           (local_d58 - local_ae8.begin.y) * local_b30 + lVar39 * 8 +
                           local_ae8.nstride * local_c50 + (long)local_ae8.begin.x * -8 + local_c40;
                  local_b38 = local_aa8.jstride * 8;
                  lVar41 = (long)local_aa8.p +
                           local_aa8.nstride * local_c50 +
                           (local_d58 - local_aa8.begin.y) * local_b38 +
                           (lVar34 - local_aa8.begin.z) * local_aa8.kstride * 8 +
                           (long)local_aa8.begin.x * -8 + local_c40 + 8;
                  local_b60 = ((int)local_d50 - local_a68.begin.z) * local_a68.kstride;
                  local_b68 = (long)local_a68.begin.y;
                  local_b70 = local_a68.jstride;
                  lVar39 = local_a68.jstride * 8;
                  lVar35 = (local_d58 - local_b68) * lVar39;
                  lVar37 = local_a68.kstride * 8;
                  lVar26 = local_a68.nstride * local_c50;
                  lVar40 = (lVar34 - local_a68.begin.z) * lVar37 + lVar26;
                  lVar34 = (long)local_a68.begin.x;
                  local_b40 = (ulong)(uint)(local_d18 - local_a68.begin.x);
                  local_b78 = local_a68.p;
                  lVar38 = (long)local_a68.p +
                           (local_dcc - local_a68.begin.z) * lVar37 + lVar35 + lVar26 + lVar34 * -8
                           + local_c40;
                  lVar26 = (long)local_a68.p +
                           ((long)local_dd0 - (long)local_a68.begin.z) * lVar37 + lVar35 + lVar26 +
                           lVar34 * -8 + local_c40;
                  lVar35 = (long)local_a68.p + lVar35 + lVar40 + lVar34 * -8 + local_c40 + 8;
                  local_b58 = (long)local_a68.p + lVar40 + lVar34 * -8 + local_c40;
                  local_d48 = local_a68.nstride * local_d60;
                  iVar24 = local_d14 - local_a68.begin.y;
                  local_dc8 = local_da4.smallend.vect[1];
                  iStack_dc4 = local_da4.smallend.vect[1] >> 0x1f;
                  dVar2 = (double)((long)local_a68.p +
                                  (local_c48 - local_b68) * lVar39 + lVar40 + lVar34 * -8 +
                                  local_c40);
                  do {
                    local_d88 = dVar2;
                    if (local_da4.smallend.vect[0] <= local_da4.bigend.vect[0]) {
                      lVar34 = 0;
                      do {
                        dVar2 = *(double *)(lVar35 + -8 + lVar34 * 8);
                        *(double *)(lVar31 + lVar34 * 8) =
                             ((*(double *)(lVar26 + lVar34 * 8) - dVar2) *
                              *(double *)(local_d08 + lVar34 * 8) -
                             (dVar2 - *(double *)(lVar38 + lVar34 * 8)) *
                             *(double *)(lVar36 + lVar34 * 8)) * (double)local_648._0_8_ +
                             ((*(double *)((long)local_d88 + lVar34 * 8) - dVar2) *
                              *(double *)(lVar42 + lVar34 * 8) -
                             (dVar2 - *(double *)(iVar24 * lVar39 + local_b58 + lVar34 * 8)) *
                             *(double *)(lVar33 + lVar34 * 8)) * (double)local_668._0_8_ +
                             *(double *)(lVar43 + lVar34 * 8) * local_c70 * dVar2 +
                             ((*(double *)(lVar35 + lVar34 * 8) - dVar2) *
                              *(double *)(lVar41 + lVar34 * 8) -
                             (dVar2 - local_a68.p
                                      [(CONCAT44(iStack_dc4,local_dc8) - local_b68) *
                                       local_a68.jstride +
                                       local_b60 +
                                       local_d48 + ((local_d18 - local_a68.begin.x) + (int)lVar34)])
                             * *(double *)(lVar41 + -8 + lVar34 * 8)) * (double)local_658._0_8_;
                        lVar34 = lVar34 + 1;
                      } while (uVar23 != (uint)lVar34);
                    }
                    lVar34 = CONCAT44(iStack_dc4,local_dc8) + 1;
                    lVar31 = lVar31 + local_d40;
                    lVar43 = lVar43 + local_d38;
                    lVar36 = lVar36 + local_d68;
                    local_d08 = local_d08 + local_d68;
                    lVar42 = lVar42 + local_b30;
                    lVar33 = lVar33 + local_b30;
                    lVar41 = lVar41 + local_b38;
                    lVar38 = lVar38 + lVar39;
                    lVar26 = lVar26 + lVar39;
                    lVar35 = lVar35 + lVar39;
                    iVar24 = iVar24 + 1;
                    local_dc8 = (int)lVar34;
                    iStack_dc4 = (int)((ulong)lVar34 >> 0x20);
                    dVar2 = (double)((long)local_d88 + lVar39);
                  } while (local_d10 != local_dc8);
                }
                uVar25 = (int)local_d50 + 1;
                bVar45 = (int)local_d50 != local_da4.bigend.vect[2];
                local_dd0 = local_dd0 + 1;
                local_dcc = local_dcc + 1;
                local_d50 = (ulong)uVar25;
                uVar29 = (ulong)uVar25;
              } while (bVar45);
            }
            local_d60 = local_d60 + 1;
            local_c50 = local_c50 + 8;
          } while (local_d60 != local_c58);
        }
      }
      else if (FVar22 == covered) {
        if (0 < (int)ncomp) {
          local_d68 = CONCAT44(local_d68._4_4_,local_da4.smallend.vect[2]);
          local_d88 = (double)(long)local_da4.smallend.vect[1];
          lVar39 = (long)local_da4.smallend.vect[0];
          uVar23 = local_da4.bigend.vect[0] - local_da4.smallend.vect[0];
          local_d08 = CONCAT44(local_d08._4_4_,local_da4.bigend.vect[1]);
          local_d38 = CONCAT44(local_d38._4_4_,
                               (local_da4.bigend.vect[1] - local_da4.smallend.vect[1]) + 1);
          local_de8 = 0;
          uVar29 = 0;
          do {
            local_d40 = uVar29;
            if ((int)local_d68 <= iVar11) {
              local_db8 = local_d68 & 0xffffffff;
              do {
                iVar30 = (int)local_db8;
                if (SUB84(local_d88,0) <= (int)local_d08) {
                  lVar26 = local_c38.jstride * 8;
                  __s = (void *)((long)local_c38.p +
                                local_c38.nstride * local_de8 +
                                ((long)local_d88 - (long)local_c38.begin.y) * lVar26 +
                                (iVar30 - local_c38.begin.z) * local_c38.kstride * 8 +
                                (long)local_c38.begin.x * -8 + lVar39 * 8);
                  iVar32 = (int)local_d38;
                  do {
                    if (iVar24 <= iVar10) {
                      memset(__s,0,(ulong)uVar23 * 8 + 8);
                    }
                    __s = (void *)((long)__s + lVar26);
                    iVar32 = iVar32 + -1;
                  } while (iVar32 != 0);
                }
                local_db8 = (ulong)(iVar30 + 1);
              } while (iVar30 != iVar11);
            }
            uVar29 = local_d40 + 1;
            local_de8 = local_de8 + 8;
          } while (uVar29 != local_c58);
        }
      }
      else {
        FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                  (&local_590,local_bb8,&local_630);
        FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>
                  (&local_6b8,pFVar27,&local_630);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_6f8,local_c80,&local_630);
        MultiCutFab::const_array(&local_738,local_bd8,&local_630);
        MultiCutFab::const_array(&local_778,pMStack_bd0,&local_630);
        MultiCutFab::const_array(&local_7b8,local_bc8,&local_630);
        MultiCutFab::const_array(&local_7f8,local_bf8,&local_630);
        MultiCutFab::const_array(&local_838,pMStack_bf0,&local_630);
        MultiCutFab::const_array((Array4<const_double> *)local_878,local_be8,&local_630);
        MultiCutFab::const_array((Array4<const_double> *)local_8b8,local_c88,&local_630);
        MultiCutFab::const_array((Array4<const_double> *)local_8f8,local_c90,&local_630);
        MultiCutFab::const_array(&local_5d0,local_c98,&local_630);
        if (local_c78._M_head_impl == (MultiFab *)0x0) {
          local_9a8._16_8_ = local_908;
          local_9a8._24_8_ = uStack_900;
          local_9a8._0_8_ = local_918;
          local_9a8._8_8_ = uStack_910;
          local_988 = (double *)0x100000001;
          local_980 = 1;
          local_97c = (int)local_928;
          iStack_978 = (int)((ulong)local_928 >> 0x20);
          iStack_974 = (int)uStack_920;
          iStack_970 = uStack_920._4_4_;
LAB_0061ce0e:
          local_9e8._16_8_ = local_908;
          local_9e8._24_8_ = uStack_900;
          local_9e8._0_8_ = local_918;
          local_9e8._8_8_ = uStack_910;
          local_9c8 = (double *)0x100000001;
          local_9c0 = 1;
          local_9bc = (int)local_928;
          iStack_9b8 = (int)((ulong)local_928 >> 0x20);
          iStack_9b4 = (int)uStack_920;
          iStack_9b0 = uStack_920._4_4_;
        }
        else {
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((Array4<const_double> *)local_9a8,
                     (FabArray<amrex::FArrayBox> *)
                     (&(((this->m_eb_b_coeffs).
                         super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                       ).
                       super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)[local_bc0][local_ce8]._M_t,
                     &local_630);
          if (iVar7 == 0) goto LAB_0061ce0e;
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((Array4<const_double> *)local_9e8,
                     (FabArray<amrex::FArrayBox> *)
                     (this->m_eb_phi).
                     super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                     .
                     super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[local_cf0]._M_t.
                     super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,
                     &local_630);
        }
        iVar11 = iStack_14c;
        LVar8 = this->m_phi_loc;
        local_538._812_4_ = local_7f8.end.z;
        uVar14 = local_538._812_4_;
        local_538._816_4_ = local_7f8.ncomp;
        uVar15 = local_538._816_4_;
        local_538._776_4_ = (undefined4)local_7f8.kstride;
        uVar12 = local_538._776_4_;
        local_538._780_4_ = (undefined4)((ulong)local_7f8.kstride >> 0x20);
        uVar13 = local_538._780_4_;
        iStack_1cc = (int)_iStack_9b4;
        iVar24 = iStack_1cc;
        iStack_1c8 = SUB84(_iStack_9b4,4);
        iVar10 = iStack_1c8;
        iStack_14c = (int)uStack_8c4;
        iVar30 = iStack_14c;
        iStack_148 = SUB84(uStack_8c4,4);
        iVar32 = iStack_148;
        iStack_104 = local_838.end.z;
        iVar16 = iStack_104;
        iStack_100 = local_838.ncomp;
        iVar17 = iStack_100;
        iStack_c4 = (int)uStack_844;
        iVar18 = iStack_c4;
        iStack_c0 = SUB84(uStack_844,4);
        iVar19 = iStack_c0;
        iStack_84 = (int)uStack_884;
        iVar20 = iStack_84;
        iStack_80 = SUB84(uStack_884,4);
        iVar21 = iStack_80;
        if (LVar8 == CellCentroid && local_d24 == 0) {
          local_538._52_4_ = local_6b8.end.z;
          local_538._56_4_ = local_6b8.ncomp;
          local_538._32_4_ = local_6b8.begin.x;
          local_538._36_4_ = local_6b8.begin.y;
          local_538._16_8_ = local_6b8.kstride;
          local_538._24_8_ = local_6b8.nstride;
          local_538._0_8_ = local_6b8.p;
          local_538._8_8_ = local_6b8.jstride;
          local_538._116_4_ = local_c38.end.z;
          local_538._120_4_ = local_c38.ncomp;
          local_538._80_8_ = local_c38.kstride;
          local_538._88_8_ = local_c38.nstride;
          local_538._64_8_ = local_c38.p;
          local_538._72_8_ = local_c38.jstride;
          local_538._128_8_ = local_c70;
          *(ulong *)((long)local_ca0 + 0x2c) = CONCAT44(local_a28.end.y,local_a28.end.x);
          *(undefined8 *)((long)local_ca0 + 0x34) = local_a28._52_8_;
          local_ca0[4] = CONCAT44(local_a28.begin.y,local_a28.begin.x);
          local_ca0[5] = CONCAT44(local_a28.end.x,local_a28.begin.z);
          local_ca0[2] = local_a28.kstride;
          local_ca0[3] = local_a28.nstride;
          *local_ca0 = (long)local_a28.p;
          local_ca0[1] = local_a28.jstride;
          *(ulong *)((long)local_ca8 + 0x2c) = CONCAT44(local_a68.end.y,local_a68.end.x);
          *(undefined8 *)((long)local_ca8 + 0x34) = local_a68._52_8_;
          local_ca8[4] = CONCAT44(local_a68.begin.y,local_a68.begin.x);
          local_ca8[5] = CONCAT44(local_a68.end.x,local_a68.begin.z);
          local_ca8[2] = local_a68.kstride;
          local_ca8[3] = local_a68.nstride;
          *local_ca8 = (long)local_a68.p;
          local_ca8[1] = local_a68.jstride;
          local_538._264_8_ = local_938._0_8_;
          *(ulong *)((long)local_cb0 + 0x2c) = CONCAT44(local_aa8.end.y,local_aa8.end.x);
          *(undefined8 *)((long)local_cb0 + 0x34) = local_aa8._52_8_;
          local_cb0[4] = CONCAT44(local_aa8.begin.y,local_aa8.begin.x);
          local_cb0[5] = CONCAT44(local_aa8.end.x,local_aa8.begin.z);
          local_cb0[2] = local_aa8.kstride;
          local_cb0[3] = local_aa8.nstride;
          *local_cb0 = (long)local_aa8.p;
          local_cb0[1] = local_aa8.jstride;
          local_538._336_8_ = local_948._0_8_;
          *(ulong *)((long)local_cb8 + 0x2c) = CONCAT44(local_ae8.end.y,local_ae8.end.x);
          *(undefined8 *)((long)local_cb8 + 0x34) = local_ae8._52_8_;
          local_cb8[4] = CONCAT44(local_ae8.begin.y,local_ae8.begin.x);
          local_cb8[5] = CONCAT44(local_ae8.end.x,local_ae8.begin.z);
          local_cb8[2] = local_ae8.kstride;
          local_cb8[3] = local_ae8.nstride;
          *local_cb8 = (long)local_ae8.p;
          local_cb8[1] = local_ae8.jstride;
          local_538._408_8_ = local_d70;
          *(ulong *)((long)local_cc0 + 0x2c) = CONCAT44(local_b28.end.y,local_b28.end.x);
          *(undefined8 *)((long)local_cc0 + 0x34) = local_b28._52_8_;
          local_cc0[4] = CONCAT44(local_b28.begin.y,local_b28.begin.x);
          local_cc0[5] = CONCAT44(local_b28.end.x,local_b28.begin.z);
          local_cc0[2] = local_b28.kstride;
          local_cc0[3] = local_b28.nstride;
          *local_cc0 = (long)local_b28.p;
          local_cc0[1] = local_b28.jstride;
          *(ulong *)((long)local_cc8 + 0x2c) = CONCAT44(local_6f8.end.y,local_6f8.end.x);
          *(undefined8 *)((long)local_cc8 + 0x34) = local_6f8._52_8_;
          local_cc8[4] = local_6f8.begin._0_8_;
          local_cc8[5] = CONCAT44(local_6f8.end.x,local_6f8.begin.z);
          local_cc8[2] = local_6f8.kstride;
          local_cc8[3] = local_6f8.nstride;
          *local_cc8 = local_6f8.p;
          local_cc8[1] = local_6f8.jstride;
          *(ulong *)((long)local_cd0 + 0x2c) = CONCAT44(local_738.end.y,local_738.end.x);
          *(undefined8 *)((long)local_cd0 + 0x34) = local_738._52_8_;
          local_cd0[4] = local_738.begin._0_8_;
          local_cd0[5] = CONCAT44(local_738.end.x,local_738.begin.z);
          local_cd0[2] = local_738.kstride;
          local_cd0[3] = local_738.nstride;
          *local_cd0 = local_738.p;
          local_cd0[1] = local_738.jstride;
          *(ulong *)((long)local_cd8 + 0x2c) = CONCAT44(local_778.end.y,local_778.end.x);
          *(undefined8 *)((long)local_cd8 + 0x34) = local_778._52_8_;
          local_cd8[4] = local_778.begin._0_8_;
          local_cd8[5] = CONCAT44(local_778.end.x,local_778.begin.z);
          local_cd8[2] = local_778.kstride;
          local_cd8[3] = local_778.nstride;
          *local_cd8 = local_778.p;
          local_cd8[1] = local_778.jstride;
          *(ulong *)((long)local_ce0 + 0x2c) = CONCAT44(local_7b8.end.y,local_7b8.end.x);
          *(undefined8 *)((long)local_ce0 + 0x34) = local_7b8._52_8_;
          local_ce0[4] = local_7b8.begin._0_8_;
          local_ce0[5] = CONCAT44(local_7b8.end.x,local_7b8.begin.z);
          local_ce0[2] = local_7b8.kstride;
          local_ce0[3] = local_7b8.nstride;
          *local_ce0 = local_7b8.p;
          local_ce0[1] = local_7b8.jstride;
          uVar29 = local_140;
          local_538._736_4_ = local_d28;
          local_538._740_4_ = local_678;
          local_538._744_4_ = iStack_674;
          local_538._748_4_ = iStack_670;
          local_538._752_4_ = iStack_66c;
          local_538._756_4_ = local_d2c;
          local_538._808_4_ = local_7f8.end.y;
          local_538._792_4_ = local_7f8.begin.x;
          local_538._796_4_ = local_7f8.begin.y;
          local_538._800_4_ = local_7f8.begin.z;
          local_538._804_4_ = local_7f8.end.x;
          local_538._784_4_ = (undefined4)local_7f8.nstride;
          local_538._788_4_ = (undefined4)((ulong)local_7f8.nstride >> 0x20);
          local_538._760_8_ = local_7f8.p;
          local_538._768_8_ = local_7f8.jstride;
          iStack_1d0 = iStack_9b8;
          local_538._856_4_ = SUB84(local_9c8,0);
          local_538._860_4_ = (undefined4)((ulong)local_9c8 >> 0x20);
          local_538[0x360] = SUB41(local_9c0,0);
          local_1d7 = SUB41((uint)local_9c0 >> 8,0);
          local_1d6 = SUB41((uint)local_9c0 >> 0x10,0);
          uStack_1d5 = (undefined1)((uint)local_9c0 >> 0x18);
          local_1d4 = local_9bc;
          local_538._840_4_ = (undefined4)local_9e8._16_8_;
          local_538._844_4_ = SUB84(local_9e8._16_8_,4);
          local_538._848_4_ = (undefined4)local_9e8._24_8_;
          local_538._852_4_ = SUB84(local_9e8._24_8_,4);
          local_538._824_8_ = local_9e8._0_8_;
          local_538._832_8_ = local_9e8._8_8_;
          iStack_190 = local_5d0.end.y;
          iStack_18c = local_5d0.end.z;
          iStack_188 = local_5d0.ncomp;
          iStack_1a0 = local_5d0.begin.x;
          iStack_19c = local_5d0.begin.y;
          iStack_198 = local_5d0.begin.z;
          local_1b0 = local_5d0.kstride;
          iStack_1a8 = (int)local_5d0.nstride;
          iStack_1a4 = (int)((ulong)local_5d0.nstride >> 0x20);
          local_1c0 = local_5d0.p;
          LStack_1b8 = local_5d0.jstride;
          bStack_150 = SUB41(iStack_8c8,0);
          bStack_14f = SUB41((uint)iStack_8c8 >> 8,0);
          uStack_14e = (undefined2)((uint)iStack_8c8 >> 0x10);
          iStack_160 = (int)local_8f8._32_8_;
          iStack_15c = SUB84(local_8f8._32_8_,4);
          iStack_158 = iStack_8d0;
          local_170 = (double *)local_8f8._16_8_;
          iStack_168 = (int)local_8f8._24_8_;
          iStack_164 = SUB84(local_8f8._24_8_,4);
          local_180 = (double *)local_8f8._0_8_;
          LStack_178 = local_8f8._8_8_;
          local_140._0_2_ = CONCAT11(iVar7 != 0,bVar44);
          local_140._5_3_ = SUB83(uVar29,5);
          local_140 = CONCAT35(local_140._5_3_,
                               CONCAT14(uVar6,CONCAT13(uVar5,CONCAT12(uVar4,(undefined2)local_140)))
                              ) ^ 0x101010000;
          iStack_108 = local_838.end.y;
          iStack_118 = local_838.begin.x;
          iStack_114 = local_838.begin.y;
          iStack_110 = local_838.begin.z;
          local_128 = (double *)local_838.kstride;
          iStack_120 = (int)local_838.nstride;
          iStack_11c = (int)((ulong)local_838.nstride >> 0x20);
          local_138 = local_838.p;
          uStack_130 = local_838.jstride;
          iStack_c8 = iStack_848;
          iStack_d8 = (int)local_878._32_8_;
          iStack_d4 = SUB84(local_878._32_8_,4);
          iStack_d0 = iStack_850;
          local_e8 = (double *)local_878._16_8_;
          iStack_e0 = (int)local_878._24_8_;
          iStack_dc = SUB84(local_878._24_8_,4);
          local_f8 = (double *)local_878._0_8_;
          LStack_f0 = local_878._8_8_;
          iStack_88 = iStack_888;
          iStack_98 = (int)local_8b8._32_8_;
          iStack_94 = SUB84(local_8b8._32_8_,4);
          iStack_90 = iStack_890;
          local_a8 = (double *)local_8b8._16_8_;
          iStack_a0 = (int)local_8b8._24_8_;
          iStack_9c = SUB84(local_8b8._24_8_,4);
          local_b8 = (double *)local_8b8._0_8_;
          LStack_b0 = local_8b8._8_8_;
          iStack_48 = iStack_978;
          iStack_44 = iStack_974;
          iStack_40 = iStack_970;
          iStack_58 = (int)local_988;
          iStack_54 = (int)((ulong)local_988 >> 0x20);
          iStack_50 = local_980;
          local_4c = local_97c;
          local_68 = (double *)local_9a8._16_8_;
          iStack_60 = (int)local_9a8._24_8_;
          iStack_5c = SUB84(local_9a8._24_8_,4);
          local_78 = (double *)local_9a8._0_8_;
          uStack_70 = local_9a8._8_8_;
          Loop<amrex::mlebabeclap_adotx_centroid(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<amrex::EBCellFlag_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,int_const&,int_const&,int_const&,int_const&,int_const&,int_const&,bool_const&,bool_const&,bool_const&,bool,bool,amrex::GpuArray<double,3u>const&,double,double,int)::_lambda(int,int,int,int)_1_>
                    (&local_968,ncomp,(anon_class_1280_34_0a4fdabd *)local_538);
        }
        else {
          LVar9 = this->m_beta_loc;
          local_538._52_4_ = local_6b8.end.z;
          local_538._56_4_ = local_6b8.ncomp;
          local_538._32_4_ = local_6b8.begin.x;
          local_538._36_4_ = local_6b8.begin.y;
          local_538._16_8_ = local_6b8.kstride;
          local_538._24_8_ = local_6b8.nstride;
          local_538._0_8_ = local_6b8.p;
          local_538._8_8_ = local_6b8.jstride;
          local_538._116_4_ = local_c38.end.z;
          local_538._120_4_ = local_c38.ncomp;
          local_538._80_8_ = local_c38.kstride;
          local_538._88_8_ = local_c38.nstride;
          local_538._64_8_ = local_c38.p;
          local_538._72_8_ = local_c38.jstride;
          local_538._128_8_ = local_c70;
          iStack_14c = iVar11;
          *(ulong *)((long)local_ca0 + 0x2c) = CONCAT44(local_a28.end.y,local_a28.end.x);
          *(undefined8 *)((long)local_ca0 + 0x34) = local_a28._52_8_;
          local_ca0[4] = CONCAT44(local_a28.begin.y,local_a28.begin.x);
          local_ca0[5] = CONCAT44(local_a28.end.x,local_a28.begin.z);
          local_ca0[2] = local_a28.kstride;
          local_ca0[3] = local_a28.nstride;
          *local_ca0 = (long)local_a28.p;
          local_ca0[1] = local_a28.jstride;
          *(ulong *)((long)local_ca8 + 0x2c) = CONCAT44(local_a68.end.y,local_a68.end.x);
          *(undefined8 *)((long)local_ca8 + 0x34) = local_a68._52_8_;
          local_ca8[4] = CONCAT44(local_a68.begin.y,local_a68.begin.x);
          local_ca8[5] = CONCAT44(local_a68.end.x,local_a68.begin.z);
          local_ca8[2] = local_a68.kstride;
          local_ca8[3] = local_a68.nstride;
          *local_ca8 = (long)local_a68.p;
          local_ca8[1] = local_a68.jstride;
          local_538._264_8_ = local_938._0_8_;
          *(ulong *)((long)local_cb0 + 0x2c) = CONCAT44(local_aa8.end.y,local_aa8.end.x);
          *(undefined8 *)((long)local_cb0 + 0x34) = local_aa8._52_8_;
          local_cb0[4] = CONCAT44(local_aa8.begin.y,local_aa8.begin.x);
          local_cb0[5] = CONCAT44(local_aa8.end.x,local_aa8.begin.z);
          local_cb0[2] = local_aa8.kstride;
          local_cb0[3] = local_aa8.nstride;
          *local_cb0 = (long)local_aa8.p;
          local_cb0[1] = local_aa8.jstride;
          local_538._336_8_ = local_948._0_8_;
          *(ulong *)((long)local_cb8 + 0x2c) = CONCAT44(local_ae8.end.y,local_ae8.end.x);
          *(undefined8 *)((long)local_cb8 + 0x34) = local_ae8._52_8_;
          local_cb8[4] = CONCAT44(local_ae8.begin.y,local_ae8.begin.x);
          local_cb8[5] = CONCAT44(local_ae8.end.x,local_ae8.begin.z);
          local_cb8[2] = local_ae8.kstride;
          local_cb8[3] = local_ae8.nstride;
          *local_cb8 = (long)local_ae8.p;
          local_cb8[1] = local_ae8.jstride;
          local_538._408_8_ = local_d70;
          *(ulong *)((long)local_cc0 + 0x2c) = CONCAT44(local_b28.end.y,local_b28.end.x);
          *(undefined8 *)((long)local_cc0 + 0x34) = local_b28._52_8_;
          local_cc0[4] = CONCAT44(local_b28.begin.y,local_b28.begin.x);
          local_cc0[5] = CONCAT44(local_b28.end.x,local_b28.begin.z);
          local_cc0[2] = local_b28.kstride;
          local_cc0[3] = local_b28.nstride;
          *local_cc0 = (long)local_b28.p;
          local_cc0[1] = local_b28.jstride;
          *(ulong *)((long)local_cc8 + 0x2c) = CONCAT44(local_6f8.end.y,local_6f8.end.x);
          *(undefined8 *)((long)local_cc8 + 0x34) = local_6f8._52_8_;
          local_cc8[4] = local_6f8.begin._0_8_;
          local_cc8[5] = CONCAT44(local_6f8.end.x,local_6f8.begin.z);
          local_cc8[2] = local_6f8.kstride;
          local_cc8[3] = local_6f8.nstride;
          *local_cc8 = local_6f8.p;
          local_cc8[1] = local_6f8.jstride;
          *(ulong *)((long)local_cd0 + 0x2c) = CONCAT44(local_738.end.y,local_738.end.x);
          *(undefined8 *)((long)local_cd0 + 0x34) = local_738._52_8_;
          local_cd0[4] = local_738.begin._0_8_;
          local_cd0[5] = CONCAT44(local_738.end.x,local_738.begin.z);
          local_cd0[2] = local_738.kstride;
          local_cd0[3] = local_738.nstride;
          *local_cd0 = local_738.p;
          local_cd0[1] = local_738.jstride;
          *(ulong *)((long)local_cd8 + 0x2c) = CONCAT44(local_778.end.y,local_778.end.x);
          *(undefined8 *)((long)local_cd8 + 0x34) = local_778._52_8_;
          local_cd8[4] = local_778.begin._0_8_;
          local_cd8[5] = CONCAT44(local_778.end.x,local_778.begin.z);
          local_cd8[2] = local_778.kstride;
          local_cd8[3] = local_778.nstride;
          *local_cd8 = local_778.p;
          local_cd8[1] = local_778.jstride;
          *(ulong *)((long)local_ce0 + 0x2c) = CONCAT44(local_7b8.end.y,local_7b8.end.x);
          *(undefined8 *)((long)local_ce0 + 0x34) = local_7b8._52_8_;
          local_ce0[4] = local_7b8.begin._0_8_;
          local_ce0[5] = CONCAT44(local_7b8.end.x,local_7b8.begin.z);
          local_ce0[2] = local_7b8.kstride;
          local_ce0[3] = local_7b8.nstride;
          *local_ce0 = local_7b8.p;
          local_ce0[1] = local_7b8.jstride;
          local_538._784_4_ = local_7f8.end.y;
          local_538._768_4_ = local_7f8.begin.x;
          local_538._772_4_ = local_7f8.begin.y;
          local_538._776_4_ = local_7f8.begin.z;
          local_538._780_4_ = local_7f8.end.x;
          local_538._760_8_ = local_7f8.nstride;
          local_538._736_4_ = SUB84(local_7f8.p,0);
          local_538._740_4_ = (undefined4)((ulong)local_7f8.p >> 0x20);
          local_538._744_4_ = (undefined4)local_7f8.jstride;
          local_538._748_4_ = (undefined4)((ulong)local_7f8.jstride >> 0x20);
          local_538._848_4_ = local_590.end.y;
          local_538._852_4_ = local_590.end.z;
          local_538._856_4_ = local_590.ncomp;
          local_538._832_4_ = local_590.begin.x;
          local_538._836_4_ = local_590.begin.y;
          local_538._840_4_ = local_590.begin.z;
          local_538._844_4_ = local_590.end.x;
          local_538._816_4_ = (undefined4)local_590.kstride;
          local_538._820_4_ = (undefined4)((ulong)local_590.kstride >> 0x20);
          local_538._824_8_ = local_590.nstride;
          local_538._800_4_ = SUB84(local_590.p,0);
          local_538._804_4_ = (undefined4)((ulong)local_590.p >> 0x20);
          local_538._808_4_ = (undefined4)local_590.jstride;
          local_538._812_4_ = (undefined4)((ulong)local_590.jstride >> 0x20);
          local_1d6 = LVar9 == FaceCentroid;
          local_538[0x360] = !local_1d6;
          iStack_1a0 = local_838.end.y;
          local_1b0._0_4_ = local_838.begin.x;
          local_1b0._4_4_ = local_838.begin.y;
          iStack_1a8 = local_838.begin.z;
          iStack_1a4 = local_838.end.x;
          local_1c0 = (double *)local_838.kstride;
          LStack_1b8 = local_838.nstride;
          iStack_1d0 = (int)local_838.p;
          iStack_1cc = (int)((ulong)local_838.p >> 0x20);
          iStack_1c8 = (int)local_838.jstride;
          uStack_1c4 = (undefined4)((ulong)local_838.jstride >> 0x20);
          iStack_160 = iStack_848;
          local_170 = (double *)local_878._32_8_;
          iStack_168 = iStack_850;
          iStack_164 = iStack_84c;
          local_180 = (double *)local_878._16_8_;
          LStack_178 = local_878._24_8_;
          iStack_190 = (int)local_878._0_8_;
          iStack_18c = SUB84(local_878._0_8_,4);
          iStack_188 = (int)local_878._8_8_;
          uStack_184 = SUB84(local_878._8_8_,4);
          iStack_118 = iStack_9b8;
          local_128 = local_9c8;
          iStack_120 = local_9c0;
          iStack_11c = local_9bc;
          local_138 = (double *)local_9e8._16_8_;
          uStack_130 = local_9e8._24_8_;
          iStack_148 = (int)local_9e8._0_8_;
          uStack_144 = SUB84(local_9e8._0_8_,4);
          local_140 = local_9e8._8_8_;
          iStack_d8 = iStack_8c8;
          local_e8 = (double *)local_8f8._32_8_;
          iStack_e0 = iStack_8d0;
          iStack_dc = iStack_8cc;
          local_f8 = (double *)local_8f8._16_8_;
          LStack_f0 = local_8f8._24_8_;
          iStack_108 = (int)local_8f8._0_8_;
          iStack_104 = SUB84(local_8f8._0_8_,4);
          iStack_100 = (int)local_8f8._8_8_;
          uStack_fc = SUB84(local_8f8._8_8_,4);
          iStack_98 = iStack_888;
          local_a8 = (double *)local_8b8._32_8_;
          iStack_a0 = iStack_890;
          iStack_9c = iStack_88c;
          local_b8 = (double *)local_8b8._16_8_;
          LStack_b0 = local_8b8._24_8_;
          iStack_c8 = (int)local_8b8._0_8_;
          iStack_c4 = SUB84(local_8b8._0_8_,4);
          iStack_c0 = (int)local_8b8._8_8_;
          uStack_bc = SUB84(local_8b8._8_8_,4);
          iStack_58 = iStack_978;
          iStack_54 = (int)_iStack_974;
          iStack_50 = SUB84(_iStack_974,4);
          local_68 = local_988;
          iStack_60 = local_980;
          iStack_5c = local_97c;
          local_78 = (double *)local_9a8._16_8_;
          uStack_70 = local_9a8._24_8_;
          iStack_88 = (int)local_9a8._0_8_;
          iStack_84 = SUB84(local_9a8._0_8_,4);
          iStack_80 = (int)local_9a8._8_8_;
          uStack_7c = SUB84(local_9a8._8_8_,4);
          local_538._752_4_ = uVar12;
          local_538._756_4_ = uVar13;
          local_538._788_4_ = uVar14;
          local_538._792_4_ = uVar15;
          local_1d7 = LVar8 != CellCentroid;
          iStack_19c = iVar16;
          iStack_198 = iVar17;
          iStack_15c = iVar18;
          iStack_158 = iVar19;
          bStack_150 = bVar44;
          bStack_14f = iVar7 != 0;
          iStack_114 = iVar24;
          iStack_110 = iVar10;
          iStack_d4 = iVar30;
          iStack_d0 = iVar32;
          iStack_94 = iVar20;
          iStack_90 = iVar21;
          Loop<amrex::mlebabeclap_adotx(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<int_const>const&,amrex::Array4<amrex::EBCellFlag_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,bool,amrex::Array4<double_const>const&,bool,amrex::GpuArray<double,3u>const&,double,double,int,bool,bool)::_lambda(int,int,int,int)_1_>
                    (&local_968,ncomp,(anon_class_1264_28_cfe7304b *)local_538);
        }
      }
      MFIter::operator++(&local_630);
    } while (local_630.currentIndex < local_630.endIndex);
  }
  MFIter::~MFIter(&local_630);
  return;
}

Assistant:

void
MLEBABecLap::Fapply (int amrlev, int mglev, MultiFab& out, const MultiFab& in) const
{
    BL_PROFILE("MLEBABecLap::Fapply()");

    const MultiFab& acoef = m_a_coeffs[amrlev][mglev];
    AMREX_D_TERM(const MultiFab& bxcoef = m_b_coeffs[amrlev][mglev][0];,
                 const MultiFab& bycoef = m_b_coeffs[amrlev][mglev][1];,
                 const MultiFab& bzcoef = m_b_coeffs[amrlev][mglev][2];);
    const iMultiFab& ccmask = m_cc_mask[amrlev][mglev];

    const auto dxinvarr = m_geom[amrlev][mglev].InvCellSizeArray();

    auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[amrlev][mglev].get());
    const FabArray<EBCellFlagFab>* flags = (factory) ? &(factory->getMultiEBCellFlagFab()) : nullptr;
    const MultiFab* vfrac = (factory) ? &(factory->getVolFrac()) : nullptr;
    auto area = (factory) ? factory->getAreaFrac()
        : Array<const MultiCutFab*,AMREX_SPACEDIM>{AMREX_D_DECL(nullptr,nullptr,nullptr)};
    auto fcent = (factory) ? factory->getFaceCent()
        : Array<const MultiCutFab*,AMREX_SPACEDIM>{AMREX_D_DECL(nullptr,nullptr,nullptr)};
    const MultiCutFab* barea = (factory) ? &(factory->getBndryArea()) : nullptr;
    const MultiCutFab* bcent = (factory) ? &(factory->getBndryCent()) : nullptr;
    const auto         ccent = (factory) ? &(factory->getCentroid()) : nullptr;

    const bool is_eb_dirichlet =  isEBDirichlet();
    const bool is_eb_inhomog = m_is_eb_inhomog;

    const int ncomp = getNComp();

    Array4<Real const> foo;

    const Real ascalar = m_a_scalar;
    const Real bscalar = m_b_scalar;

    const Box& domain_box = m_geom[amrlev][mglev].Domain();

    AMREX_D_TERM(
        const int domlo_x = domain_box.smallEnd(0);
        const int domhi_x = domain_box.bigEnd(0);,
        const int domlo_y = domain_box.smallEnd(1);
        const int domhi_y = domain_box.bigEnd(1);,
        const int domlo_z = domain_box.smallEnd(2);
        const int domhi_z = domain_box.bigEnd(2););

    AMREX_D_TERM(
        const bool extdir_x = !(m_geom[amrlev][mglev].isPeriodic(0));,
        const bool extdir_y = !(m_geom[amrlev][mglev].isPeriodic(1));,
        const bool extdir_z = !(m_geom[amrlev][mglev].isPeriodic(2)););

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(out, mfi_info); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        Array4<Real const> const& xfab = in.const_array(mfi);
        Array4<Real> const& yfab = out.array(mfi);
        Array4<Real const> const& afab = acoef.const_array(mfi);
        AMREX_D_TERM(Array4<Real const> const& bxfab = bxcoef.const_array(mfi);,
                     Array4<Real const> const& byfab = bycoef.const_array(mfi);,
                     Array4<Real const> const& bzfab = bzcoef.const_array(mfi););

        auto fabtyp = (flags) ? (*flags)[mfi].getType(bx) : FabType::regular;

        if (fabtyp == FabType::covered) {
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D( bx, ncomp, i, j, k, n,
            {
                yfab(i,j,k,n) = 0.0;
            });
        } else if (fabtyp == FabType::regular) {
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D( bx, ncomp, i, j, k, n,
            {
                mlabeclap_adotx(i,j,k,n, yfab, xfab, afab,
                                AMREX_D_DECL(bxfab,byfab,bzfab),
                                dxinvarr, ascalar, bscalar);
            });
        } else {
            Array4<int const> const& ccmfab = ccmask.const_array(mfi);
            Array4<EBCellFlag const> const& flagfab = flags->const_array(mfi);
            Array4<Real const> const& vfracfab = vfrac->const_array(mfi);
            AMREX_D_TERM(Array4<Real const> const& apxfab = area[0]->const_array(mfi);,
                         Array4<Real const> const& apyfab = area[1]->const_array(mfi);,
                         Array4<Real const> const& apzfab = area[2]->const_array(mfi););
            AMREX_D_TERM(Array4<Real const> const& fcxfab = fcent[0]->const_array(mfi);,
                         Array4<Real const> const& fcyfab = fcent[1]->const_array(mfi);,
                         Array4<Real const> const& fczfab = fcent[2]->const_array(mfi););
            Array4<Real const> const& bafab = barea->const_array(mfi);
            Array4<Real const> const& bcfab = bcent->const_array(mfi);
            Array4<Real const> const& ccfab = ccent->const_array(mfi);
            Array4<Real const> const& bebfab = (is_eb_dirichlet)
                ? m_eb_b_coeffs[amrlev][mglev]->const_array(mfi) : foo;
            Array4<Real const> const& phiebfab = (is_eb_dirichlet && is_eb_inhomog)
                ? m_eb_phi[amrlev]->const_array(mfi) : foo;

            bool beta_on_centroid = (m_beta_loc == Location::FaceCentroid);
            bool  phi_on_centroid = (m_phi_loc  == Location::CellCentroid);

            bool treat_phi_as_on_centroid = ( phi_on_centroid && (mglev == 0) );

            if (treat_phi_as_on_centroid) {
#ifdef AMREX_USE_HIP
                // This causes an abort in HIP 4.5 but works in earlier versions
                // A follow-up release should fix this.
                // Error message:
                //   lld: error: ran out of registers during register allocation
                amrex::Abort("MLEBABecLap::Fapply: phi on centroid not supported for HIP");
                amrex::ignore_unused(AMREX_D_DECL(domlo_x, domlo_y, domlo_z),
                                     AMREX_D_DECL(domhi_x, domhi_y, domhi_z),
                                     AMREX_D_DECL(extdir_x, extdir_y, extdir_z));
                amrex::ignore_unused(ccfab);
#else
               AMREX_LAUNCH_HOST_DEVICE_LAMBDA ( bx, tbx,
               {
                   mlebabeclap_adotx_centroid(tbx, yfab, xfab, afab, AMREX_D_DECL(bxfab,byfab,bzfab),
                                     flagfab, vfracfab,
                                     AMREX_D_DECL(apxfab,apyfab,apzfab),
                                     AMREX_D_DECL(fcxfab,fcyfab,fczfab),
                                     ccfab, bafab, bcfab, bebfab, phiebfab,
                                     AMREX_D_DECL(domlo_x, domlo_y, domlo_z),
                                     AMREX_D_DECL(domhi_x, domhi_y, domhi_z),
                                     AMREX_D_DECL(extdir_x, extdir_y, extdir_z),
                                     is_eb_dirichlet, is_eb_inhomog, dxinvarr,
                                     ascalar, bscalar, ncomp);
               });
#endif
            } else {
               AMREX_LAUNCH_HOST_DEVICE_LAMBDA ( bx, tbx,
               {
                   mlebabeclap_adotx(tbx, yfab, xfab, afab, AMREX_D_DECL(bxfab,byfab,bzfab),
                                     ccmfab, flagfab, vfracfab,
                                     AMREX_D_DECL(apxfab,apyfab,apzfab),
                                     AMREX_D_DECL(fcxfab,fcyfab,fczfab),
                                     bafab, bcfab, bebfab,
                                     is_eb_dirichlet,
                                     phiebfab,
                                     is_eb_inhomog, dxinvarr,
                                     ascalar, bscalar, ncomp, beta_on_centroid, phi_on_centroid);
               });
            }
        }
    }
}